

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressSirius.cpp
# Opt level: O1

size_t __thiscall
adios2::core::compress::CompressSirius::DecompressV1
          (CompressSirius *this,char *bufferIn,size_t sizeIn,char *dataOut)

{
  size_type *psVar1;
  size_type __n;
  pointer __src;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *p_Var2;
  size_t sVar3;
  undefined8 *puVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  size_type sVar7;
  Dims *dimensions;
  Dims *dimensions_00;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  undefined8 uVar11;
  pointer pcVar12;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *bmap;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  string blockId;
  Dims blockCount;
  Dims blockStart;
  key_type local_d0;
  size_t local_b0;
  char *local_a8;
  string local_a0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_80;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_68;
  string local_50;
  
  __n = *(size_type *)bufferIn;
  local_a8 = dataOut;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_68,__n,(allocator_type *)&local_d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_80,__n,(allocator_type *)&local_d0);
  uVar9 = 8;
  for (sVar7 = __n; sVar7 != 0; sVar7 = sVar7 - 1) {
    *(undefined8 *)
     ((long)local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start + (uVar9 - 8)) = *(undefined8 *)(bufferIn + uVar9);
    uVar9 = uVar9 + 8;
  }
  uVar10 = uVar9;
  if (__n != 0) {
    uVar10 = uVar9 + __n * 8;
    sVar7 = 0;
    do {
      local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[sVar7] = *(unsigned_long *)(bufferIn + sVar7 * 8 + uVar9);
      sVar7 = sVar7 + 1;
    } while (__n != sVar7);
  }
  sVar3 = helper::GetDataTypeSize(*(DataType *)(bufferIn + uVar10));
  local_b0 = helper::GetTotalSize(&local_80,sVar3);
  helper::DimsToString_abi_cxx11_(&local_50,(helper *)&local_68,dimensions);
  helper::DimsToString_abi_cxx11_(&local_a0,(helper *)&local_80,dimensions_00);
  uVar11 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    uVar11 = local_50.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar11 < local_a0._M_string_length + local_50._M_string_length) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      uVar11 = local_a0.field_2._M_allocated_capacity;
    }
    if (local_a0._M_string_length + local_50._M_string_length <= (ulong)uVar11) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_a0,0,(char *)0x0,(ulong)local_50._M_dataplus._M_p);
      goto LAB_006fddb0;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_50,(ulong)local_a0._M_dataplus._M_p);
LAB_006fddb0:
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0.field_2._8_8_ = puVar4[3];
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar1;
    local_d0._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_d0._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  uVar9 = local_b0 / (ulong)(long)m_Tiers;
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&m_CurrentTierMap_abi_cxx11_,&local_d0);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[](m_TierBuffersMap_abi_cxx11_ + (long)*pmVar5 * 0x38,&local_d0);
  pmVar5 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&m_CurrentTierMap_abi_cxx11_,&local_d0);
  std::vector<char,_std::allocator<char>_>::resize(pmVar6,uVar9);
  memcpy((pmVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_start,bufferIn + (uVar10 | 4),uVar9);
  p_Var2 = DAT_008a3570;
  if ((*pmVar5 == m_Tiers + -1) && (m_TierBuffersMap_abi_cxx11_ != DAT_008a3570)) {
    pcVar12 = (pointer)0x0;
    this_00 = m_TierBuffersMap_abi_cxx11_;
    do {
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](this_00,&local_d0);
      __src = (pmVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
      memcpy(local_a8 + (long)pcVar12,__src,
             (long)(pmVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)__src);
      pcVar12 = (pmVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish +
                ((long)pcVar12 -
                (long)(pmVar6->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                      super__Vector_impl_data._M_start);
      this_00 = this_00 + 0x38;
    } while (this_00 != p_Var2);
  }
  m_CurrentReadFinished = 0;
  iVar8 = *pmVar5 + 1;
  *pmVar5 = iVar8;
  if (iVar8 % m_Tiers == 0) {
    iVar8 = 0;
  }
  *pmVar5 = iVar8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  sVar3 = 0;
  if (iVar8 == 0) {
    sVar3 = local_b0;
  }
  return sVar3;
}

Assistant:

size_t CompressSirius::DecompressV1(const char *bufferIn, const size_t sizeIn, char *dataOut)
{
    // Do NOT remove even if the buffer version is updated. Data might be still
    // in lagacy formats. This function must be kept for backward compatibility.
    // If a newer buffer format is implemented, create another function, e.g.
    // DecompressV2 and keep this function for decompressing lagacy data.

    size_t bufferInOffset = 0;
    const size_t ndims = GetParameter<size_t, size_t>(bufferIn, bufferInOffset);
    Dims blockStart(ndims);
    Dims blockCount(ndims);
    for (size_t i = 0; i < ndims; ++i)
    {
        blockStart[i] = GetParameter<size_t, size_t>(bufferIn, bufferInOffset);
    }
    for (size_t i = 0; i < ndims; ++i)
    {
        blockCount[i] = GetParameter<size_t, size_t>(bufferIn, bufferInOffset);
    }
    const DataType type = GetParameter<DataType>(bufferIn, bufferInOffset);

    const size_t outputBytes = helper::GetTotalSize(blockCount, helper::GetDataTypeSize(type));

    std::string blockId = helper::DimsToString(blockStart) + helper::DimsToString(blockCount);

    // decompress data and copy back to m_TierBuffers
    size_t bytesPerTier = outputBytes / m_Tiers;
    auto &currentBuffer = m_TierBuffersMap[m_CurrentTierMap[blockId]][blockId];
    auto &currentTier = m_CurrentTierMap[blockId];
    currentBuffer.resize(bytesPerTier);
    std::memcpy(currentBuffer.data(), bufferIn + bufferInOffset, bytesPerTier);

    // if called from the final tier, then merge all tier buffers and copy back
    // to dataOut
    size_t accumulatedBytes = 0;

    // TODO: it currently only copies output data back when the final tier is
    // read. However, the real Sirius algorithm should instead decide when to
    // copy back decompressed data based on required acuracy level. Once it's
    // done, it should set m_CurrentReadFinished to true to inform the MHS
    // engine that the current read is finished so that it won't read the next
    // tier.
    if (currentTier == m_Tiers - 1)
    {
        for (auto &bmap : m_TierBuffersMap)
        {
            auto &b = bmap[blockId];
            std::memcpy(dataOut + accumulatedBytes, b.data(), b.size());
            accumulatedBytes += b.size();
        }
        // set m_CurrentReadFinished to true if after the current call, the
        // required acuracy is already satisfied, so that the MHS engine knows
        // it shouldn't continue reading the next tier.
        m_CurrentReadFinished = true;
    }

    // set m_CurrentReadFinished to false if the current tier does not satisfy
    // the required acuracy, so the MHS engine will read the next tier.
    m_CurrentReadFinished = false;

    currentTier++;
    if (currentTier % m_Tiers == 0)
    {
        currentTier = 0;
    }

    if (currentTier == 0)
    {
        return outputBytes;
    }
    else
    {
        return 0;
    }
}